

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O1

bool tcu::anon_unknown_3::pixelNearLineSegment(IVec2 *pixel,Vec2 *p0,Vec2 *p1)

{
  int i;
  long lVar1;
  float sqSum_1;
  float fVar2;
  float sqSum;
  float fVar3;
  Vec2 line;
  Vec2 pixelCenterPosition;
  Vec2 v;
  float local_30 [4];
  float local_20 [4];
  
  local_20[0] = (float)pixel->m_data[0] + 0.5;
  local_20[1] = (float)pixel->m_data[1] + 0.5;
  local_30[0] = 0.0;
  local_30[1] = 0.0;
  lVar1 = 0;
  do {
    local_30[lVar1] = p1->m_data[lVar1] - p0->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  local_20[2] = 0.0;
  local_20[3] = 0.0;
  lVar1 = 0;
  do {
    local_20[lVar1 + 2] = local_20[lVar1] - p0->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  fVar2 = local_30[0] * local_20[3] - local_20[2] * local_30[1];
  fVar3 = 0.0;
  lVar1 = 0;
  do {
    fVar3 = fVar3 + local_30[lVar1] * local_30[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  if (fVar2 * fVar2 <= fVar3 + fVar3) {
    local_30[0] = 0.0;
    local_30[1] = 0.0;
    lVar1 = 0;
    do {
      local_30[lVar1] = p1->m_data[lVar1] - p0->m_data[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 == 1);
    fVar2 = 0.0;
    lVar1 = 0;
    do {
      fVar2 = fVar2 + local_30[lVar1] * local_30[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 == 1);
    if (fVar2 < 0.0) {
      fVar2 = sqrtf(fVar2);
    }
    else {
      fVar2 = SQRT(fVar2);
    }
    local_30[0] = 0.0;
    local_30[1] = 0.0;
    lVar1 = 0;
    do {
      local_30[lVar1] = local_20[lVar1] - p0->m_data[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 == 1);
    fVar3 = 0.0;
    lVar1 = 0;
    do {
      fVar3 = fVar3 + local_30[lVar1] * local_30[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 == 1);
    local_30[3] = fVar2 + 1.414;
    if (fVar3 < 0.0) {
      fVar3 = sqrtf(fVar3);
    }
    else {
      fVar3 = SQRT(fVar3);
    }
    if (fVar3 <= local_30[3]) {
      local_30[0] = 0.0;
      local_30[1] = 0.0;
      lVar1 = 0;
      do {
        local_30[lVar1] = local_20[lVar1] - p1->m_data[lVar1];
        lVar1 = lVar1 + 1;
      } while (lVar1 == 1);
      fVar2 = 0.0;
      lVar1 = 0;
      do {
        fVar2 = fVar2 + local_30[lVar1] * local_30[lVar1];
        lVar1 = lVar1 + 1;
      } while (lVar1 == 1);
      if (fVar2 < 0.0) {
        fVar2 = sqrtf(fVar2);
      }
      else {
        fVar2 = SQRT(fVar2);
      }
      return fVar2 <= local_30[3];
    }
  }
  return false;
}

Assistant:

bool pixelNearLineSegment (const tcu::IVec2& pixel, const tcu::Vec2& p0, const tcu::Vec2& p1)
{
	const tcu::Vec2 pixelCenterPosition = tcu::Vec2((float)pixel.x() + 0.5f, (float)pixel.y() + 0.5f);

	// "Near" = Distance from the line to the pixel is less than 2 * pixel_max_radius. (pixel_max_radius = sqrt(2) / 2)
	const float maxPixelDistance		= 1.414f;
	const float maxPixelDistanceSquared	= 2.0f;

	// Near the line
	{
		const tcu::Vec2	line			= p1                  - p0;
		const tcu::Vec2	v				= pixelCenterPosition - p0;
		const float		crossProduct	= (line.x() * v.y() - line.y() * v.x());

		// distance to line: (line x v) / |line|
		//     |(line x v) / |line|| > maxPixelDistance
		// ==> (line x v)^2 / |line|^2 > maxPixelDistance^2
		// ==> (line x v)^2 > maxPixelDistance^2 * |line|^2

		if (crossProduct * crossProduct > maxPixelDistanceSquared * tcu::lengthSquared(line))
			return false;
	}

	// Between the endpoints
	{
		// distance from line endpoint 1 to pixel is less than line length + maxPixelDistance
		const float maxDistance = tcu::length(p1 - p0) + maxPixelDistance;

		if (tcu::length(pixelCenterPosition - p0) > maxDistance)
			return false;
		if (tcu::length(pixelCenterPosition - p1) > maxDistance)
			return false;
	}

	return true;
}